

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core.cc
# Opt level: O0

int16_t WebRtcAecm_CalcSuppressionGain(AecmCore *aecm)

{
  int32_t iVar1;
  short local_20;
  short local_18;
  short local_16;
  int16_t dE;
  int16_t tmp16no1;
  int16_t supGain;
  int32_t tmp32no1;
  AecmCore *aecm_local;
  
  if (aecm->currentVADValue == 0) {
    local_16 = 0;
  }
  else {
    local_20 = aecm->nearLogEnergy[0] - aecm->echoStoredLogEnergy[0];
    if (local_20 < 0) {
      local_20 = -local_20;
    }
    if (local_20 < 400) {
      if (local_20 < 200) {
        iVar1 = WebRtcSpl_DivW32W16((int)aecm->supGainErrParamDiffAB * (int)local_20 + 100,200);
        local_16 = aecm->supGainErrParamA - (short)iVar1;
      }
      else {
        iVar1 = WebRtcSpl_DivW32W16((int)aecm->supGainErrParamDiffBD * (400 - local_20) + 100,200);
        local_16 = aecm->supGainErrParamD + (short)iVar1;
      }
    }
    else {
      local_16 = aecm->supGainErrParamD;
    }
  }
  if (aecm->supGainOld < local_16) {
    local_18 = local_16;
  }
  else {
    local_18 = aecm->supGainOld;
  }
  aecm->supGainOld = local_16;
  if (local_18 < aecm->supGain) {
    aecm->supGain = aecm->supGain + (short)((int)local_18 - (int)aecm->supGain >> 4);
  }
  else {
    aecm->supGain = aecm->supGain + (short)((int)local_18 - (int)aecm->supGain >> 4);
  }
  return aecm->supGain;
}

Assistant:

int16_t WebRtcAecm_CalcSuppressionGain(AecmCore* const aecm) {
    int32_t tmp32no1;

    int16_t supGain = SUPGAIN_DEFAULT;
    int16_t tmp16no1;
    int16_t dE = 0;

    // Determine suppression gain used in the Wiener filter. The gain is based on a mix of far
    // end energy and echo estimation error.
    // Adjust for the far end signal level. A low signal level indicates no far end signal,
    // hence we set the suppression gain to 0
    if (!aecm->currentVADValue)
    {
        supGain = 0;
    } else
    {
        // Adjust for possible double talk. If we have large variations in estimation error we
        // likely have double talk (or poor channel).
        tmp16no1 = (aecm->nearLogEnergy[0] - aecm->echoStoredLogEnergy[0] - ENERGY_DEV_OFFSET);
        dE = WEBRTC_SPL_ABS_W16(tmp16no1);

        if (dE < ENERGY_DEV_TOL)
        {
            // Likely no double talk. The better estimation, the more we can suppress signal.
            // Update counters
            if (dE < SUPGAIN_EPC_DT)
            {
                tmp32no1 = aecm->supGainErrParamDiffAB * dE;
                tmp32no1 += (SUPGAIN_EPC_DT >> 1);
                tmp16no1 = (int16_t)WebRtcSpl_DivW32W16(tmp32no1, SUPGAIN_EPC_DT);
                supGain = aecm->supGainErrParamA - tmp16no1;
            } else
            {
                tmp32no1 = aecm->supGainErrParamDiffBD * (ENERGY_DEV_TOL - dE);
                tmp32no1 += ((ENERGY_DEV_TOL - SUPGAIN_EPC_DT) >> 1);
                tmp16no1 = (int16_t)WebRtcSpl_DivW32W16(tmp32no1, (ENERGY_DEV_TOL
                        - SUPGAIN_EPC_DT));
                supGain = aecm->supGainErrParamD + tmp16no1;
            }
        } else
        {
            // Likely in double talk. Use default value
            supGain = aecm->supGainErrParamD;
        }
    }

    if (supGain > aecm->supGainOld)
    {
        tmp16no1 = supGain;
    } else
    {
        tmp16no1 = aecm->supGainOld;
    }
    aecm->supGainOld = supGain;
    if (tmp16no1 < aecm->supGain)
    {
        aecm->supGain += (int16_t)((tmp16no1 - aecm->supGain) >> 4);
    } else
    {
        aecm->supGain += (int16_t)((tmp16no1 - aecm->supGain) >> 4);
    }

    // END: Update suppression gain

    return aecm->supGain;
}